

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oarchive_suite.cpp
# Opt level: O1

void array_suite::test_double_four(void)

{
  oarchive ar;
  double array [4];
  ostringstream result;
  long *local_228 [2];
  long local_218 [2];
  undefined **local_208 [6];
  type local_1d8;
  pointer local_1c0;
  pointer local_1b0;
  double local_1a8;
  double dStack_1a0;
  double local_198;
  double dStack_190;
  ostringstream local_180 [112];
  ios_base local_110 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_180);
  trial::protocol::json::basic_oarchive<char>::basic_oarchive<std::__cxx11::ostringstream>
            ((basic_oarchive<char> *)local_208,
             (basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_180);
  local_198 = 3.5;
  dStack_190 = 4.5;
  local_1a8 = 1.5;
  dStack_1a0 = 2.5;
  trial::protocol::serialization::
  save_overloader<trial::protocol::json::basic_oarchive<char>,_double[4],_void>::save
            ((basic_oarchive<char> *)local_208,(double (*) [4])&local_1a8,0);
  std::__cxx11::stringbuf::str();
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[70]>
            ("result.str()",
             "\"[1.50000000000000,2.50000000000000,3.50000000000000,4.50000000000000]\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/oarchive_suite.cpp"
             ,300,"void array_suite::test_double_four()",local_228,
             "[1.50000000000000,2.50000000000000,3.50000000000000,4.50000000000000]");
  if (local_228[0] != local_218) {
    operator_delete(local_228[0],local_218[0] + 1);
  }
  local_208[0] = &PTR_vsave_001248d0;
  if (local_1c0 != (pointer)0x0) {
    operator_delete(local_1c0,(long)local_1b0 - (long)local_1c0);
  }
  (**(code **)local_1d8._0_8_)();
  boost::archive::detail::basic_oarchive::~basic_oarchive((basic_oarchive *)local_208);
  std::__cxx11::ostringstream::~ostringstream(local_180);
  std::ios_base::~ios_base(local_110);
  return;
}

Assistant:

void test_double_four()
{
    std::ostringstream result;
    json::oarchive ar(result);
    double array[] = { 1.5, 2.5, 3.5, 4.5 };
    ar << array;
    TRIAL_PROTOCOL_TEST_EQUAL(result.str(), "[1.50000000000000,2.50000000000000,3.50000000000000,4.50000000000000]");
}